

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

tm * FIX::time_localtime(tm *__return_storage_ptr__,time_t *t)

{
  tm *__src;
  undefined1 local_48 [8];
  tm result;
  time_t *t_local;
  
  result.tm_zone = (char *)t;
  __src = localtime_r(t,(tm *)local_48);
  memcpy(__return_storage_ptr__,__src,0x38);
  return __return_storage_ptr__;
}

Assistant:

tm time_localtime(const time_t *t) {
#ifdef _MSC_VER
#if (_MSC_VER >= 1400)
  tm result;
  localtime_s(&result, t);
  return result;
#else
  return *localtime(t);
#endif
#else
  tm result;
  return *localtime_r(t, &result);
#endif
}